

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall
QWizardField::findProperty(QWizardField *this,QWizardDefaultProperty *properties,int propertyCount)

{
  bool bVar1;
  int in_EDX;
  QObject *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int i;
  QByteArray className;
  int iVar2;
  QByteArray local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray((QByteArray *)0x7b351c);
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    bVar1 = objectInheritsXAndXIsCloserThanY(in_RSI,(QByteArray *)CONCAT44(in_EDX,iVar2),in_RDI);
    if (bVar1) {
      QByteArray::operator=(&local_20,(QByteArray *)(in_RSI + (long)iVar2 * 0x48));
      QByteArray::operator=(in_RDI + 2,(QByteArray *)(in_RSI + (long)iVar2 * 0x48 + 0x18));
      QByteArray::operator=(in_RDI + 3,(QByteArray *)(in_RSI + (long)iVar2 * 0x48 + 0x30));
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x7b35d9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardField::findProperty(const QWizardDefaultProperty *properties, int propertyCount)
{
    QByteArray className;

    for (int i = 0; i < propertyCount; ++i) {
        if (objectInheritsXAndXIsCloserThanY(object, properties[i].className, className)) {
            className = properties[i].className;
            property = properties[i].property;
            changedSignal = properties[i].changedSignal;
        }
    }
}